

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonrd_opt.c
# Opt level: O0

_Bool is_prune_intra_mode(AV1_COMP *cpi,int mode_index,int force_intra_check,BLOCK_SIZE bsize,
                         uint8_t segment_id,SOURCE_SAD source_sad_nonrd,uint8_t *color_sensitivity)

{
  undefined8 uVar1;
  undefined8 uVar2;
  int iVar3;
  byte in_CL;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  byte in_R8B;
  uint in_R9D;
  bool bVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  _Bool has_color_sensitivity;
  PREDICTION_MODE this_mode;
  undefined2 in_stack_0000000c;
  
  if ((in_ESI < 3) && (in_EDX != 0)) {
    return false;
  }
  if ((1 << (""[in_ESI] & 0x1f) & *(uint *)(in_RDI + 0x60d08 + (ulong)in_CL * 4)) == 0) {
    return true;
  }
  if (""[in_ESI] != 0) {
    if ((*(byte *)(in_RDI + 0x60d48) & 1) == 0) {
      return false;
    }
    bVar4 = false;
    if (*(char *)CONCAT17(bsize,CONCAT16(segment_id,CONCAT24(in_stack_0000000c,source_sad_nonrd)))
        != '\0') {
      bVar4 = *(char *)(CONCAT17(bsize,CONCAT16(segment_id,
                                                CONCAT24(in_stack_0000000c,source_sad_nonrd))) + 1)
              != '\0';
    }
    if (bVar4) {
      uVar1 = *(undefined8 *)(in_RDI + 0x607c8);
      auVar5._8_4_ = (int)((ulong)uVar1 >> 0x20);
      auVar5._0_8_ = uVar1;
      auVar5._12_4_ = 0x45300000;
      uVar2 = *(undefined8 *)(in_RDI + 0x607b8);
      auVar6._8_4_ = (int)((ulong)uVar2 >> 0x20);
      auVar6._0_8_ = uVar2;
      auVar6._12_4_ = 0x45300000;
      if (((((auVar6._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0)) * 1.1 <
            (auVar5._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) ||
          (iVar3 = cyclic_refresh_segment_id_boosted((uint)in_R8B), iVar3 != 0)) || (3 < in_R9D)) {
        return false;
      }
    }
    return true;
  }
  return false;
}

Assistant:

static inline bool is_prune_intra_mode(
    AV1_COMP *cpi, int mode_index, int force_intra_check, BLOCK_SIZE bsize,
    uint8_t segment_id, SOURCE_SAD source_sad_nonrd,
    uint8_t color_sensitivity[MAX_MB_PLANE - 1]) {
  const PREDICTION_MODE this_mode = intra_mode_list[mode_index];
  if (mode_index > 2 || force_intra_check == 0) {
    if (!((1 << this_mode) & cpi->sf.rt_sf.intra_y_mode_bsize_mask_nrd[bsize]))
      return true;

    if (this_mode == DC_PRED) return false;

    if (!cpi->sf.rt_sf.prune_hv_pred_modes_using_src_sad) return false;

    const bool has_color_sensitivity =
        color_sensitivity[COLOR_SENS_IDX(AOM_PLANE_U)] &&
        color_sensitivity[COLOR_SENS_IDX(AOM_PLANE_V)];
    if (has_color_sensitivity &&
        (cpi->rc.frame_source_sad > 1.1 * cpi->rc.avg_source_sad ||
         cyclic_refresh_segment_id_boosted(segment_id) ||
         source_sad_nonrd > kMedSad))
      return false;

    return true;
  }
  return false;
}